

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O1

uint16_t crc_modbus(uchar *input_str,size_t num_bytes)

{
  ushort uVar1;
  size_t sVar2;
  
  if (crc_tab16_init == '\0') {
    init_crc16_tab();
  }
  uVar1 = 0xffff;
  if (num_bytes != 0 && input_str != (uchar *)0x0) {
    uVar1 = 0xffff;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crc_tab16[(byte)((byte)uVar1 ^ input_str[sVar2])];
      sVar2 = sVar2 + 1;
    } while (num_bytes != sVar2);
  }
  return uVar1;
}

Assistant:

uint16_t crc_modbus(const unsigned char *input_str, size_t num_bytes) {
  uint16_t crc;
  const unsigned char *ptr;
  size_t a;

  if (!crc_tab16_init) init_crc16_tab();

  crc = CRC_START_MODBUS;
  ptr = input_str;

  if (ptr != NULL)
    for (a = 0; a < num_bytes; a++) {
      crc = (crc >> 8) ^ crc_tab16[(crc ^ (uint16_t)*ptr++) & 0x00FF];
    }

  return crc;

}